

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(void)

{
  int iVar1;
  int *piVar2;
  iterator piVar3;
  iterator piVar4;
  iterator piVar5;
  int *x;
  iterator __end1;
  iterator __begin1;
  vector<int> *__range1;
  iterator last;
  iterator first;
  iterator position;
  int local_68;
  int la;
  int fi;
  int po;
  int i_1;
  int i;
  int a;
  int n2;
  int n1;
  undefined1 local_40 [8];
  vector<int> v2;
  vector<int> v1;
  
  CP::vector<int>::vector((vector<int> *)&v2.mSize);
  CP::vector<int>::vector((vector<int> *)local_40);
  __isoc99_scanf("%d",&a);
  CP::vector<int>::resize((vector<int> *)&v2.mSize,(long)a);
  for (po = 0; po < a; po = po + 1) {
    __isoc99_scanf("%d",&i_1);
    iVar1 = i_1;
    piVar2 = CP::vector<int>::operator[]((vector<int> *)&v2.mSize,po);
    *piVar2 = iVar1;
  }
  __isoc99_scanf("%d",&i);
  CP::vector<int>::resize((vector<int> *)local_40,(long)i);
  for (fi = 0; fi < i; fi = fi + 1) {
    __isoc99_scanf("%d",&i_1);
    iVar1 = i_1;
    piVar2 = CP::vector<int>::operator[]((vector<int> *)local_40,fi);
    *piVar2 = iVar1;
  }
  __isoc99_scanf("%d %d %d",&la,&local_68,(long)&position + 4);
  piVar3 = CP::vector<int>::begin((vector<int> *)&v2.mSize);
  piVar4 = CP::vector<int>::begin((vector<int> *)local_40);
  piVar5 = CP::vector<int>::begin((vector<int> *)local_40);
  CP::vector<int>::insert
            ((vector<int> *)&v2.mSize,piVar3 + la,piVar4 + local_68,piVar5 + position._4_4_);
  printf("Result\n");
  __end1 = CP::vector<int>::begin((vector<int> *)&v2.mSize);
  piVar3 = CP::vector<int>::end((vector<int> *)&v2.mSize);
  for (; __end1 != piVar3; __end1 = __end1 + 1) {
    printf("%d ",(ulong)(uint)*__end1);
  }
  printf("\n");
  CP::vector<int>::~vector((vector<int> *)local_40);
  CP::vector<int>::~vector((vector<int> *)&v2.mSize);
  return 0;
}

Assistant:

int main() {
  CP::vector<int> v1,v2;
  //read vector
  int n1,n2,a;
  scanf("%d",&n1);
  v1.resize(n1);
  for (int i = 0;i < n1;i++) {
    scanf("%d",&a);
    v1[i] = a;
  }
  scanf("%d",&n2);
  v2.resize(n2);
  for (int i = 0;i < n2;i++) {
    scanf("%d",&a);
    v2[i] = a;
  }

  //read position
  int po,fi,la;
  scanf("%d %d %d",&po,&fi,&la);
  CP::vector<int>::iterator position,first,last;
  position = v1.begin() + po;
  first = v2.begin() + fi;
  last = v2.begin() + la;

  //call the function
  v1.insert(position,first,last);

  //display result;
  printf("Result\n");
  for (auto &x : v1) {
    printf("%d ",x);
  }
  printf("\n");

  return 0;
}